

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA5Application.cpp
# Opt level: O2

void __thiscall
PA5Application::RenderObject::setProgramMaterial
          (RenderObject *this,shared_ptr<Program> *program,SimpleMaterial *material)

{
  Program *pPVar1;
  Sampler *pSVar2;
  allocator<char> local_61;
  string local_60;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_40;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_30;
  
  (**(((program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
     super_OGLStateObject)._vptr_OGLStateObject)();
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"lightsInWorld[0].direction",&local_61);
  local_30._0_8_ = 0xbf80000000000000;
  local_30.field_0.z = 1.0;
  local_40.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3_0
        )glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                   ((vec<3,_float,_(glm::qualifier)0> *)&local_30.field_0);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar1,&local_60,(vec<3,_float,_(glm::qualifier)0> *)&local_40.field_0);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"lightsInWorld[0].intensity",(allocator<char> *)&local_30.field_0);
  local_40.field_0.z = 0.7;
  local_40._0_1_ = '3';
  local_40._1_1_ = '3';
  local_40._2_1_ = '3';
  local_40._3_1_ = '?';
  local_40._4_1_ = '3';
  local_40._5_1_ = '3';
  local_40._6_1_ = '3';
  local_40._7_1_ = '?';
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar1,&local_60,(vec<3,_float,_(glm::qualifier)0> *)&local_40.field_0);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"lightsInWorld[1].direction",&local_61);
  local_30._0_8_ = 0x3f80000000000000;
  local_30.field_0.z = 0.5;
  local_40.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3_0
        )glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                   ((vec<3,_float,_(glm::qualifier)0> *)&local_30.field_0);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar1,&local_60,(vec<3,_float,_(glm::qualifier)0> *)&local_40.field_0);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"lightsInWorld[1].intensity",(allocator<char> *)&local_30.field_0);
  local_40.field_0.z = 0.5;
  local_40._0_8_ = 0x3f0000003f000000;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar1,&local_60,(vec<3,_float,_(glm::qualifier)0> *)&local_40.field_0);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"lightsInWorld[2].direction",&local_61);
  local_30._0_8_ = 0xbf800000;
  local_30.field_0.z = 1.0;
  local_40.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3_0
        )glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                   ((vec<3,_float,_(glm::qualifier)0> *)&local_30.field_0);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar1,&local_60,(vec<3,_float,_(glm::qualifier)0> *)&local_40.field_0);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"lightsInWorld[2].intensity",(allocator<char> *)&local_30.field_0);
  local_40.field_0.z = 0.6;
  local_40._0_8_ = 0x3f19999a3f19999a;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar1,&local_60,(vec<3,_float,_(glm::qualifier)0> *)&local_40.field_0);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"material.ambient",(allocator<char> *)&local_40.field_0);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(pPVar1,&local_60,&material->ambient);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"material.diffuse",(allocator<char> *)&local_40.field_0);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(pPVar1,&local_60,&material->diffuse);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"material.specular",(allocator<char> *)&local_40.field_0);
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(pPVar1,&local_60,&material->specular);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"material.shininess",(allocator<char> *)&local_40.field_0);
  Program::setUniform<float>(pPVar1,&local_60,&material->shininess);
  std::__cxx11::string::~string((string *)&local_60);
  pSVar2 = (this->m_diffusemap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>.
           _M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
           super__Head_base<0UL,_Sampler_*,_false>._M_head_impl;
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"material.colormap",(allocator<char> *)&local_40.field_0);
  Sampler::attachToProgram(pSVar2,pPVar1,&local_60,DoNotBind);
  std::__cxx11::string::~string((string *)&local_60);
  pSVar2 = (this->m_normalmap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>.
           _M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
           super__Head_base<0UL,_Sampler_*,_false>._M_head_impl;
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"material.normalmap",(allocator<char> *)&local_40.field_0);
  Sampler::attachToProgram(pSVar2,pPVar1,&local_60,DoNotBind);
  std::__cxx11::string::~string((string *)&local_60);
  pSVar2 = (this->m_specularmap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>.
           _M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
           super__Head_base<0UL,_Sampler_*,_false>._M_head_impl;
  pPVar1 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"material.specularmap",(allocator<char> *)&local_40.field_0);
  Sampler::attachToProgram(pSVar2,pPVar1,&local_60,DoNotBind);
  std::__cxx11::string::~string((string *)&local_60);
  (*(((program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    super_OGLStateObject)._vptr_OGLStateObject[1])();
  return;
}

Assistant:

void PA5Application::RenderObject::setProgramMaterial(std::shared_ptr<Program> & program, const SimpleMaterial & material) const
{
  program->bind();
  program->setUniform("lightsInWorld[0].direction", glm::normalize(glm::vec3(0, -1, 1)));
  program->setUniform("lightsInWorld[0].intensity", glm::vec3(0.7, 0.7, 0.7));
  program->setUniform("lightsInWorld[1].direction", glm::normalize(glm::vec3(0, 1, 0.5)));
  program->setUniform("lightsInWorld[1].intensity", glm::vec3(0.5, 0.5, 0.5));
  program->setUniform("lightsInWorld[2].direction", glm::normalize(glm::vec3(-1, 0, 1)));
  program->setUniform("lightsInWorld[2].intensity", glm::vec3(0.6, 0.6, 0.6));
  program->setUniform("material.ambient", material.ambient);
  program->setUniform("material.diffuse", material.diffuse);
  program->setUniform("material.specular", material.specular);
  program->setUniform("material.shininess", material.shininess);
  m_diffusemap->attachToProgram(*program, "material.colormap", Sampler::DoNotBind);
  m_normalmap->attachToProgram(*program, "material.normalmap", Sampler::DoNotBind);
  m_specularmap->attachToProgram(*program, "material.specularmap", Sampler::DoNotBind);
  program->unbind();
}